

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O1

Color4<float> __thiscall Imath_3_2::hsv2rgb<float>(Imath_3_2 *this,Color4<float> *hsv)

{
  Color4<float> CVar1;
  Color4<double> c;
  double local_30;
  double dStack_28;
  double local_20;
  double dStack_18;
  
  Imath_3_2::hsv2rgb_d((Color4 *)&local_30);
  CVar1.b = (float)local_20;
  CVar1.a = (float)dStack_18;
  CVar1.r = (float)local_30;
  CVar1.g = (float)dStack_28;
  *(float *)this = CVar1.r;
  *(float *)(this + 4) = CVar1.g;
  *(float *)(this + 8) = CVar1.b;
  *(float *)(this + 0xc) = CVar1.a;
  return CVar1;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Color4<T>
                                   hsv2rgb (const Color4<T>& hsv) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Color4<double> v = Color4<double> (
            hsv.r / float (std::numeric_limits<T>::max ()),
            hsv.g / float (std::numeric_limits<T>::max ()),
            hsv.b / float (std::numeric_limits<T>::max ()),
            hsv.a / float (std::numeric_limits<T>::max ()));
        Color4<double> c = hsv2rgb_d (v);
        return Color4<T> (
            (T) (c.r * std::numeric_limits<T>::max ()),
            (T) (c.g * std::numeric_limits<T>::max ()),
            (T) (c.b * std::numeric_limits<T>::max ()),
            (T) (c.a * std::numeric_limits<T>::max ()));
    }
    else
    {
        Color4<double> v = Color4<double> (hsv.r, hsv.g, hsv.b, hsv.a);
        Color4<double> c = hsv2rgb_d (v);
        return Color4<T> ((T) c.r, (T) c.g, (T) c.b, (T) c.a);
    }
}